

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void modwt(wt_object wt,double *inp)

{
  int iVar1;
  double *inp_local;
  wt_object wt_local;
  
  iVar1 = strcmp(wt->cmethod,"direct");
  if (iVar1 == 0) {
    modwt_direct(wt,inp);
  }
  else {
    iVar1 = strcmp(wt->cmethod,"fft");
    if (iVar1 != 0) {
      printf("Error- Available Choices for this method are - direct and fft \n");
      exit(-1);
    }
    modwt_fft(wt,inp);
  }
  return;
}

Assistant:

void modwt(wt_object wt, const double *inp) {
	if (!strcmp(wt->cmethod, "direct")) {
		modwt_direct(wt, inp);
	}
	else if (!strcmp(wt->cmethod, "fft")) {
		modwt_fft(wt, inp);
	}
	else {
		printf("Error- Available Choices for this method are - direct and fft \n");
		exit(-1);
	}
}